

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeBase *
MatchGenericType(ExpressionContext *ctx,SynBase *source,TypeBase *matchType,TypeBase *argType,
                IntrusiveList<MatchData> *aliases,bool strict)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  longlong length;
  MatchData *pMVar5;
  IntrusiveList<TypeHandle> arguments;
  bool bVar6;
  uint uVar7;
  int iVar8;
  TypeBase *pTVar9;
  TypeBase *pTVar10;
  undefined4 extraout_var;
  TypeArray *pTVar11;
  TypeRef *pTVar12;
  TypeUnsizedArray *pTVar13;
  undefined4 extraout_var_00;
  TypeFunction *pTVar14;
  TypeArray *rhs;
  uint *puVar15;
  longlong *plVar16;
  IntrusiveList<MatchData> *pIVar17;
  TypeGenericClassProto *lhs;
  uint *puVar18;
  IntrusiveList<MatchData> subAliases;
  TypeHandle *node;
  
  if (matchType->isGeneric == false) {
    if (argType->isGeneric == true) {
      subAliases.head = (MatchData *)0x0;
      subAliases.tail = (MatchData *)0x0;
      pTVar9 = MatchGenericType(ctx,source,argType,matchType,&subAliases,true);
      if (pTVar9 != (TypeBase *)0x0) {
        argType = pTVar9;
      }
    }
    pTVar10 = (TypeBase *)0x0;
    pTVar9 = argType;
    if (!strict) {
      pTVar10 = matchType;
    }
LAB_00144d99:
    if (pTVar9 != matchType) {
      argType = pTVar10;
    }
  }
  else {
    switch(matchType->typeID) {
    case 0xc:
      if (!strict) {
        if (argType == (TypeBase *)0x0) break;
        uVar7 = argType->typeID;
        if (uVar7 != 0x13) goto LAB_00144d54;
        argType = (TypeBase *)
                  ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)argType[1]._vptr_TypeBase);
      }
      if ((TypeUnsizedArray *)argType != (TypeUnsizedArray *)0x0) {
        uVar7 = (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID;
LAB_00144d54:
        if (uVar7 != 0) {
          return (TypeBase *)(TypeUnsizedArray *)argType;
        }
        return (TypeBase *)0x0;
      }
      break;
    case 0xd:
      pIVar17 = aliases;
      if (!strict) {
        if (argType == (TypeBase *)0x0) {
          argType = (TypeBase *)0x0;
        }
        else if (argType->typeID == 0x13) {
          argType = (TypeBase *)
                    ExpressionContext::GetUnsizedArrayType
                              (ctx,(TypeBase *)argType[1]._vptr_TypeBase);
        }
      }
      while (pMVar5 = pIVar17->head, pMVar5 != (MatchData *)0x0) {
        bVar6 = InplaceStr::operator==
                          (&pMVar5->name->name,(InplaceStr *)(matchType[1]._vptr_TypeBase + 8));
        if (bVar6) {
          pTVar13 = (TypeUnsizedArray *)pMVar5->type;
          if (!strict) {
            return (TypeBase *)pTVar13;
          }
          if (pTVar13 != (TypeUnsizedArray *)argType) {
            return (TypeBase *)0x0;
          }
          return (TypeBase *)pTVar13;
        }
        pIVar17 = (IntrusiveList<MatchData> *)&pMVar5->next;
      }
      if ((((TypeUnsizedArray *)argType == (TypeUnsizedArray *)0x0) ||
          (uVar7 = (((TypeUnsizedArray *)argType)->super_TypeStruct).super_TypeBase.typeID,
          0x1c < uVar7)) || ((0x1c000001U >> (uVar7 & 0x1f) & 1) == 0)) {
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        MatchData::MatchData
                  ((MatchData *)CONCAT44(extraout_var_00,iVar8),
                   (SynIdentifier *)matchType[1]._vptr_TypeBase,argType);
        IntrusiveList<MatchData>::push_back(aliases,(MatchData *)CONCAT44(extraout_var_00,iVar8));
        return (TypeBase *)(TypeUnsizedArray *)argType;
      }
      break;
    default:
      anon_unknown.dwarf_94284::Stop(ctx,source,"ERROR: unknown generic type match");
    case 0x12:
      if ((argType == (TypeBase *)0x0) || (argType->typeID != 0x12)) {
        if (strict) break;
        pTVar9 = (TypeBase *)matchType[1]._vptr_TypeBase;
      }
      else {
        pTVar9 = (TypeBase *)matchType[1]._vptr_TypeBase;
        argType = (TypeBase *)argType[1]._vptr_TypeBase;
      }
      pTVar9 = MatchGenericType(ctx,source,pTVar9,argType,aliases,true);
      if (pTVar9 != (TypeBase *)0x0) {
        pTVar12 = ExpressionContext::GetReferenceType(ctx,pTVar9);
        return &pTVar12->super_TypeBase;
      }
      break;
    case 0x13:
      if ((((argType != (TypeBase *)0x0) && (argType->typeID == 0x13)) &&
          (lVar3._0_4_ = matchType[1].typeID, lVar3._4_4_ = matchType[1].nameHash,
          lVar4._0_4_ = argType[1].typeID, lVar4._4_4_ = argType[1].nameHash, lVar3 == lVar4)) &&
         (pTVar9 = MatchGenericType(ctx,source,(TypeBase *)matchType[1]._vptr_TypeBase,
                                    (TypeBase *)argType[1]._vptr_TypeBase,aliases,true),
         pTVar9 != (TypeBase *)0x0)) {
        length._0_4_ = matchType[1].typeID;
        length._4_4_ = matchType[1].nameHash;
        pTVar11 = ExpressionContext::GetArrayType(ctx,pTVar9,length);
        return &pTVar11->super_TypeBase;
      }
      break;
    case 0x14:
      if (argType != (TypeBase *)0x0) {
        if (argType->typeID == 0x14) {
          pTVar9 = *(TypeBase **)&matchType[1].typeIndex;
          pTVar10 = *(TypeBase **)&argType[1].typeIndex;
        }
        else {
          if (argType->typeID != 0x13 || strict) break;
          pTVar9 = *(TypeBase **)&matchType[1].typeIndex;
          pTVar10 = (TypeBase *)argType[1]._vptr_TypeBase;
        }
        pTVar9 = MatchGenericType(ctx,source,pTVar9,pTVar10,aliases,true);
        if (pTVar9 != (TypeBase *)0x0) {
          pTVar13 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar9);
          return (TypeBase *)pTVar13;
        }
      }
      break;
    case 0x15:
      if (((argType != (TypeBase *)0x0) && (argType->typeID == 0x15)) &&
         (pTVar9 = MatchGenericType(ctx,source,(TypeBase *)matchType[1]._vptr_TypeBase,
                                    (TypeBase *)argType[1]._vptr_TypeBase,aliases,true),
         pTVar9 != (TypeBase *)0x0)) {
        subAliases.head = (MatchData *)0x0;
        subAliases.tail = (MatchData *)0x0;
        puVar18 = &matchType[1].typeID;
        puVar15 = &argType[1].typeID;
        while( true ) {
          puVar2 = *(undefined8 **)puVar18;
          puVar1 = *(undefined8 **)puVar15;
          if ((puVar2 == (undefined8 *)0x0) || (puVar1 == (undefined8 *)0x0)) break;
          pTVar10 = MatchGenericType(ctx,source,(TypeBase *)*puVar2,(TypeBase *)*puVar1,aliases,true
                                    );
          if (pTVar10 == (TypeBase *)0x0) goto LAB_001450a1;
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          node = (TypeHandle *)CONCAT44(extraout_var,iVar8);
          node->type = pTVar10;
          node->next = (TypeHandle *)0x0;
          node->listed = false;
          IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&subAliases,node);
          puVar18 = (uint *)(puVar2 + 1);
          puVar15 = (uint *)(puVar1 + 1);
        }
        if (puVar2 == (undefined8 *)0x0 && puVar1 == (undefined8 *)0x0) {
          arguments.tail = (TypeHandle *)subAliases.tail;
          arguments.head = (TypeHandle *)subAliases.head;
          pTVar14 = ExpressionContext::GetFunctionType(ctx,source,pTVar9,arguments);
          return &pTVar14->super_TypeBase;
        }
      }
      break;
    case 0x16:
      if ((argType != (TypeBase *)0x0) && (argType->typeID == 0x18)) {
        pTVar10 = (TypeBase *)0x0;
        pTVar9 = *(TypeBase **)&argType[2].typeIndex;
        goto LAB_00144d99;
      }
      break;
    case 0x17:
      if (((argType != (TypeBase *)0x0) && (argType->typeID == 0x18)) &&
         (matchType[1]._vptr_TypeBase == *(_func_int ***)&argType[2].typeIndex)) {
        puVar15 = &matchType[1].typeID;
        plVar16 = &argType[2].size;
        while( true ) {
          puVar2 = *(undefined8 **)puVar15;
          if (puVar2 == (undefined8 *)0x0) {
            return argType;
          }
          lVar3 = *plVar16;
          if (lVar3 == 0) {
            return argType;
          }
          pTVar9 = MatchGenericType(ctx,source,(TypeBase *)*puVar2,*(TypeBase **)(lVar3 + 8),aliases
                                    ,true);
          if (pTVar9 == (TypeBase *)0x0) break;
          puVar15 = (uint *)(puVar2 + 1);
          plVar16 = (longlong *)(lVar3 + 0x10);
        }
      }
    }
LAB_001450a1:
    argType = (TypeBase *)0x0;
  }
  return argType;
}

Assistant:

TypeBase* MatchGenericType(ExpressionContext &ctx, SynBase *source, TypeBase *matchType, TypeBase *argType, IntrusiveList<MatchData> &aliases, bool strict)
{
	if(!matchType->isGeneric)
	{
		if(argType->isGeneric)
		{
			IntrusiveList<MatchData> subAliases;

			if(TypeBase *improved = MatchGenericType(ctx, source, argType, matchType, subAliases, true))
				argType = improved;
		}

		if(matchType == argType)
			return argType;

		if(strict)
			return NULL;

		return matchType;
	}

	// 'generic' match with 'type' results with 'type'
	if(isType<TypeGeneric>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		if(isType<TypeError>(argType))
			return NULL;

		return argType;
	}

	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(matchType))
	{
		if(!strict)
		{
			// 'generic' match with 'type[N]' results with 'type[]'
			if(TypeArray *rhs = getType<TypeArray>(argType))
				argType = ctx.GetUnsizedArrayType(rhs->subType);
		}

		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
			{
				if(strict)
				{
					if(curr->type != argType)
						return NULL;
				}

				return curr->type;
			}
		}

		if(isType<TypeError>(argType))
			return NULL;

		if(isType<TypeArgumentSet>(argType) || isType<TypeMemberSet>(argType) || isType<TypeFunctionSet>(argType))
			return NULL;

		aliases.push_back(new (ctx.get<MatchData>()) MatchData(lhs->baseName, argType));

		return argType;
	}

	if(TypeRef *lhs = getType<TypeRef>(matchType))
	{
		// 'generic ref' match with 'type ref' results with 'type ref'
		if(TypeRef *rhs = getType<TypeRef>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetReferenceType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic ref' match with 'type' results with 'type ref'
		if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, argType, aliases, true))
			return ctx.GetReferenceType(match);

		return NULL;
	}

	if(TypeArray *lhs = getType<TypeArray>(matchType))
	{
		// Only match with arrays of the same size
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(lhs->length == rhs->length)
			{
				if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
					return ctx.GetArrayType(match, lhs->length);

				return NULL;
			}
		}

		return NULL;
	}

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(matchType))
	{
		// 'generic[]' match with 'type[]' results with 'type[]'
		if(TypeUnsizedArray *rhs = getType<TypeUnsizedArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);

			return NULL;
		}

		if(strict)
			return NULL;

		// 'generic[]' match with 'type[N]' results with 'type[]'
		if(TypeArray *rhs = getType<TypeArray>(argType))
		{
			if(TypeBase *match = MatchGenericType(ctx, source, lhs->subType, rhs->subType, aliases, true))
				return ctx.GetUnsizedArrayType(match);
		}

		return NULL;
	}

	if(TypeFunction *lhs = getType<TypeFunction>(matchType))
	{
		// Only match with other function type
		if(TypeFunction *rhs = getType<TypeFunction>(argType))
		{
			TypeBase *returnType = MatchGenericType(ctx, source, lhs->returnType, rhs->returnType, aliases, true);

			if(!returnType)
				return NULL;

			IntrusiveList<TypeHandle> arguments;

			TypeHandle *lhsArg = lhs->arguments.head;
			TypeHandle *rhsArg = rhs->arguments.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argMatched));

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			// Different number of arguments
			if(lhsArg || rhsArg)
				return NULL;

			return ctx.GetFunctionType(source, returnType, arguments);
		}

		return NULL;
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs->proto != rhs->proto)
				return NULL;

			TypeHandle *lhsArg = lhs->generics.head;
			MatchData *rhsArg = rhs->generics.head;

			while(lhsArg && rhsArg)
			{
				TypeBase *argMatched = MatchGenericType(ctx, source, lhsArg->type, rhsArg->type, aliases, true);

				if(!argMatched)
					return NULL;

				lhsArg = lhsArg->next;
				rhsArg = rhsArg->next;
			}

			return argType;
		}

		return NULL;
	}

	if(TypeGenericClassProto *lhs = getType<TypeGenericClassProto>(matchType))
	{
		// Match with a generic class instance
		if(TypeClass *rhs = getType<TypeClass>(argType))
		{
			if(lhs != rhs->proto)
				return NULL;

			return argType;
		}

		return NULL;
	}

	Stop(ctx, source, "ERROR: unknown generic type match");

	return NULL;
}